

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveAlign::Encode(CDirectiveAlign *this)

{
  size_t in_RCX;
  int local_ac;
  int local_9c;
  undefined1 local_98 [4];
  int n;
  uchar AlignBuffer [128];
  CDirectiveAlign *this_local;
  
  local_9c = computePadding(this);
  local_ac = local_9c;
  if (0x80 < local_9c) {
    local_ac = 0x80;
  }
  memset(local_98,0,(long)local_ac);
  for (; 0x80 < local_9c; local_9c = local_9c + -0x80) {
    FileManager::write(g_fileManager,(int)local_98,(void *)0x80,in_RCX);
  }
  FileManager::write(g_fileManager,(int)local_98,(void *)(long)local_9c,in_RCX);
  return;
}

Assistant:

void CDirectiveAlign::Encode()
{
	unsigned char AlignBuffer[128];
	
	int n = computePadding();
	memset(AlignBuffer,0,n > 128 ? 128 : n);
	while (n > 128)
	{
		g_fileManager->write(AlignBuffer,128);
		n -= 128;
	}
	g_fileManager->write(AlignBuffer,n);
}